

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::ProgressBar(float fraction,ImVec2 *size_arg,char *overlay)

{
  ImVec2 IVar1;
  ImGuiWindow *pIVar2;
  ImVec2 IVar3;
  ImDrawList *draw_list;
  undefined1 auVar4 [12];
  ImGuiContext *pIVar5;
  bool bVar6;
  ImU32 IVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  ImVec2 overlay_size;
  char overlay_buf [32];
  float local_a8;
  float fStack_a4;
  ImVec2 local_80;
  ImRect local_78;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  char local_48 [32];
  
  pIVar5 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->SkipItems == false) {
    IVar1 = *size_arg;
    IVar3 = (pIVar2->DC).CursorPos;
    fVar8 = CalcItemWidth();
    fVar12 = (pIVar5->Style).FramePadding.y;
    local_58 = CalcItemSize(IVar1,fVar8,fVar12 + fVar12 + pIVar5->FontSize);
    local_a8 = IVar3.x;
    fStack_a4 = IVar3.y;
    local_78.Max.x = local_58.x + local_a8;
    local_78.Max.y = local_58.y + fStack_a4;
    local_78.Min = IVar3;
    ItemSize(&local_58,(pIVar5->Style).FramePadding.y);
    bVar6 = ItemAdd(&local_78,0,(ImRect *)0x0,0);
    IVar3 = local_78.Max;
    IVar1 = local_78.Min;
    if (bVar6) {
      fVar12 = 1.0;
      if (fraction <= 1.0) {
        fVar12 = fraction;
      }
      fVar12 = (float)(~-(uint)(fraction < 0.0) & (uint)fVar12);
      IVar7 = GetColorU32(7,1.0);
      RenderFrame(IVar1,IVar3,IVar7,true,(pIVar5->Style).FrameRounding);
      fVar8 = (pIVar5->Style).FrameBorderSize;
      auVar9._4_4_ = fVar8;
      auVar9._0_4_ = fVar8;
      auVar9._8_4_ = fVar8;
      auVar9._12_4_ = fVar8;
      fVar13 = local_78.Min.x + fVar8;
      fVar11 = local_78.Max.x - fVar8;
      auVar4._4_8_ = auVar9._8_8_;
      auVar4._0_4_ = local_78.Min.y - fVar8;
      auVar10._0_8_ = auVar4._0_8_ << 0x20;
      auVar10._8_4_ = fVar11;
      auVar10._12_4_ = local_78.Max.y - fVar8;
      local_78.Max = auVar10._8_8_;
      local_78.Min.y = local_78.Min.y + fVar8;
      local_78.Min.x = fVar13;
      draw_list = pIVar2->DrawList;
      IVar7 = GetColorU32(0x28,1.0);
      RenderRectFilledRangeH(draw_list,&local_78,IVar7,0.0,fVar12,(pIVar5->Style).FrameRounding);
      if (overlay == (char *)0x0) {
        overlay = local_48;
        ImFormatString(overlay,0x20,"%.0f%%",(double)(fVar12 * 100.0 + 0.01));
      }
      local_80 = CalcTextSize(overlay,(char *)0x0,false,-1.0);
      if (0.0 < local_80.x) {
        fVar8 = (fVar11 - fVar13) * fVar12 + fVar13 + (pIVar5->Style).ItemSpacing.x;
        fVar12 = (local_78.Max.x - local_80.x) - (pIVar5->Style).ItemInnerSpacing.x;
        if (fVar8 <= fVar12) {
          fVar12 = fVar8;
        }
        local_50.x = (float)(-(uint)(fVar8 < local_78.Min.x) & (uint)local_78.Min.x |
                            ~-(uint)(fVar8 < local_78.Min.x) & (uint)fVar12);
        local_50.y = local_78.Min.y;
        local_60.x = 0.0;
        local_60.y = 0.5;
        RenderTextClipped(&local_50,&local_78.Max,overlay,(char *)0x0,&local_80,&local_60,&local_78)
        ;
      }
    }
  }
  return;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}